

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O1

void __thiscall
cereal::InputArchive<cereal::PortableBinaryInputArchive,_1U>::InputArchive
          (InputArchive<cereal::PortableBinaryInputArchive,_1U> *this,
          PortableBinaryInputArchive *derived)

{
  (this->super_InputArchiveBase)._vptr_InputArchiveBase = (_func_int **)&PTR__InputArchive_003edfb0;
  this->self = derived;
  (this->itsBaseClassSet)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->itsBaseClassSet)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(this->itsBaseClassSet)._M_h._M_rehash_policy = 0;
  (this->itsBaseClassSet)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->itsBaseClassSet)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->itsBaseClassSet)._M_h._M_buckets = &(this->itsBaseClassSet)._M_h._M_single_bucket;
  (this->itsBaseClassSet)._M_h._M_bucket_count = 1;
  (this->itsBaseClassSet)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->itsBaseClassSet)._M_h._M_element_count = 0;
  (this->itsBaseClassSet)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->itsSharedPointerMap)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->itsSharedPointerMap)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(this->itsSharedPointerMap)._M_h._M_rehash_policy = 0;
  (this->itsSharedPointerMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->itsSharedPointerMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->itsBaseClassSet)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->itsBaseClassSet)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->itsSharedPointerMap)._M_h._M_buckets = &(this->itsSharedPointerMap)._M_h._M_single_bucket;
  (this->itsSharedPointerMap)._M_h._M_bucket_count = 1;
  (this->itsSharedPointerMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->itsSharedPointerMap)._M_h._M_element_count = 0;
  (this->itsSharedPointerMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->itsSharedPointerMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->itsSharedPointerMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->itsPolymorphicTypeMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)&(this->itsPolymorphicTypeMap)._M_h._M_rehash_policy = 0;
  (this->itsPolymorphicTypeMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->itsPolymorphicTypeMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->itsPolymorphicTypeMap)._M_h._M_element_count = 0;
  (this->itsPolymorphicTypeMap)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->itsPolymorphicTypeMap)._M_h._M_bucket_count = 0;
  (this->itsPolymorphicTypeMap)._M_h._M_buckets =
       &(this->itsPolymorphicTypeMap)._M_h._M_single_bucket;
  (this->itsPolymorphicTypeMap)._M_h._M_bucket_count = 1;
  (this->itsPolymorphicTypeMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->itsPolymorphicTypeMap)._M_h._M_element_count = 0;
  (this->itsPolymorphicTypeMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->itsVersionedTypes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)&(this->itsVersionedTypes)._M_h._M_rehash_policy = 0;
  (this->itsVersionedTypes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->itsVersionedTypes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->itsVersionedTypes)._M_h._M_element_count = 0;
  (this->itsVersionedTypes)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->itsVersionedTypes)._M_h._M_bucket_count = 0;
  (this->itsPolymorphicTypeMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->itsPolymorphicTypeMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->itsVersionedTypes)._M_h._M_buckets = &(this->itsVersionedTypes)._M_h._M_single_bucket;
  (this->itsVersionedTypes)._M_h._M_bucket_count = 1;
  (this->itsVersionedTypes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->itsVersionedTypes)._M_h._M_element_count = 0;
  (this->itsVersionedTypes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->itsVersionedTypes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->itsVersionedTypes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

InputArchive(ArchiveType * const derived) :
        self(derived),
        itsBaseClassSet(),
        itsSharedPointerMap(),
        itsPolymorphicTypeMap(),
        itsVersionedTypes()
      { }